

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O3

int32_t u_parseCodePointRange(char *s,uint32_t *pStart,uint32_t *pEnd,UErrorCode *pErrorCode)

{
  int32_t iVar1;
  ulong uVar2;
  char *terminator;
  byte *local_10;
  
  iVar1 = u_parseCodePointRangeAnyTerminator(s,pStart,pEnd,(char **)&local_10,pErrorCode);
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    for (; uVar2 = (ulong)*local_10, uVar2 < 0x3c; local_10 = local_10 + 1) {
      if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x800000000000001U >> (uVar2 & 0x3f) & 1) != 0) {
          return iVar1;
        }
        break;
      }
    }
    *pErrorCode = U_PARSE_ERROR;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseCodePointRange(const char *s,
                      uint32_t *pStart, uint32_t *pEnd,
                      UErrorCode *pErrorCode) {
    const char *terminator;
    int32_t rangeLength=
        u_parseCodePointRangeAnyTerminator(s, pStart, pEnd, &terminator, pErrorCode);
    if(U_SUCCESS(*pErrorCode)) {
        terminator=u_skipWhitespace(terminator);
        if(*terminator!=';' && *terminator!=0) {
            *pErrorCode=U_PARSE_ERROR;
            return 0;
        }
    }
    return rangeLength;
}